

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.h
# Opt level: O0

DFA<covenant::Sym> *
covenant::witness_impl::to_automata<covenant::Sym>(witness_t *witness,TermFactory *tfac)

{
  bool bVar1;
  State SVar2;
  uint uVar3;
  State SVar4;
  size_type sVar5;
  socklen_t *psVar6;
  socklen_t *__addr_len;
  const_reference pvVar7;
  socklen_t *in_RCX;
  sockaddr *__addr;
  sockaddr *__addr_00;
  vector<int,_std::allocator<int>_> *in_RSI;
  DFA<covenant::Sym> *in_RDI;
  uint i;
  uint n;
  State curr;
  State prev;
  State final;
  State start;
  State final_1;
  State start_1;
  DFA<covenant::Sym> *dfa;
  TermFactory *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff40;
  uint uVar8;
  uint in_stack_ffffffffffffff94;
  State s;
  undefined4 local_68;
  undefined4 local_64;
  int in_stack_ffffffffffffffa4;
  DFA<covenant::Sym> *in_stack_ffffffffffffffa8;
  
  bVar1 = std::vector<int,_std::allocator<int>_>::empty(in_stack_ffffffffffffff40);
  if (bVar1) {
    boost::shared_ptr<covenant::TerminalFactory>::shared_ptr
              ((shared_ptr<covenant::TerminalFactory> *)
               CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               in_stack_ffffffffffffff28);
    DFA<covenant::Sym>::DFA
              ((DFA<covenant::Sym> *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               in_stack_ffffffffffffff28);
    boost::shared_ptr<covenant::TerminalFactory>::~shared_ptr
              ((shared_ptr<covenant::TerminalFactory> *)0x21bca4);
    SVar4 = DFA<covenant::Sym>::state(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4);
    SVar2 = DFA<covenant::Sym>::state(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4);
    DFA<covenant::Sym>::setStart(in_RDI,SVar4);
    DFA<covenant::Sym>::accept(in_RDI,SVar2.id,__addr,in_RCX);
  }
  else {
    boost::shared_ptr<covenant::TerminalFactory>::shared_ptr
              ((shared_ptr<covenant::TerminalFactory> *)
               CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               in_stack_ffffffffffffff28);
    DFA<covenant::Sym>::DFA
              ((DFA<covenant::Sym> *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               in_stack_ffffffffffffff28);
    boost::shared_ptr<covenant::TerminalFactory>::~shared_ptr
              ((shared_ptr<covenant::TerminalFactory> *)0x21bdc4);
    sVar5 = std::vector<int,_std::allocator<int>_>::size(in_RSI);
    uVar3 = (uint)sVar5;
    for (uVar8 = 0; psVar6 = (socklen_t *)(ulong)uVar8,
        __addr_len = (socklen_t *)std::vector<int,_std::allocator<int>_>::size(in_RSI),
        psVar6 <= __addr_len; uVar8 = uVar8 + 1) {
      SVar4 = DFA<covenant::Sym>::state(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4);
      SVar2 = SVar4;
      if (uVar8 != 0) {
        if (uVar8 == uVar3) {
          local_68 = SVar4;
        }
        s.id = in_stack_ffffffffffffff94;
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](in_RSI,(ulong)(uVar8 - 1));
        Sym::mkTerm(*pvVar7);
        DFA<covenant::Sym>::transition
                  ((DFA<covenant::Sym> *)CONCAT44(uVar3,uVar8),s,
                   (Sym *)CONCAT44(SVar4.id,in_stack_ffffffffffffff94),SVar2);
        SVar4.id = SVar2.id;
        SVar2.id = local_64;
      }
      local_64 = SVar2.id;
      in_stack_ffffffffffffff94 = SVar4.id;
    }
    DFA<covenant::Sym>::setStart(in_RDI,local_64);
    DFA<covenant::Sym>::accept(in_RDI,local_68,__addr_00,__addr_len);
  }
  return in_RDI;
}

Assistant:

DFA<EdgeSym> to_automata(const witness_t &witness, TermFactory tfac)
  {
    if (witness.empty())
    {
      DFA<EdgeSym> dfa (tfac);
      State start = dfa.state(0);
      State final = dfa.state(1);
      dfa.setStart(start);
      dfa.accept(final);
      return dfa;
    }

    DFA<EdgeSym> dfa (tfac);
    State start, final;
    State prev , curr;
    unsigned n = witness.size();
    for(unsigned i=0; i<= witness.size(); i++)
    {
      curr = dfa.state(i);
      if (i == 0)
        start = curr;
      else
      {
        if (i == n)
        {
          final = curr;
        }
        dfa.transition(prev, EdgeSym::mkTerm(witness[i-1]), curr);
      }
      prev = curr;
    }
    dfa.setStart(start);
    dfa.accept(final);
    return dfa;
  }